

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

void __thiscall SQCompilation::SQParser::checkSuspiciousBracket(SQParser *this)

{
  char *pcVar1;
  SQParser *in_RDI;
  char op [2];
  undefined1 local_a;
  undefined1 local_9;
  
  if ((((in_RDI->_expression_context == SQE_ARRAY_ELEM) ||
       (in_RDI->_expression_context == SQE_FUNCTION_ARG)) && ((in_RDI->_lex)._prevtoken != 0x2c)) &&
     (((in_RDI->_lex)._prevflags & 3) != 0)) {
    local_a = (undefined1)in_RDI->_token;
    local_9 = 0;
    pcVar1 = "access to member";
    if (in_RDI->_token == 0x28) {
      pcVar1 = "function call";
    }
    reportDiagnostic(in_RDI,0x6c,&local_a,pcVar1);
  }
  return;
}

Assistant:

void SQParser::checkSuspiciousBracket() {
  assert(_token == _SC('(') || _token == _SC('['));
  if (_expression_context == SQE_ARRAY_ELEM || _expression_context == SQE_FUNCTION_ARG) {
    if (_lex._prevtoken != _SC(',')) {
      if (_lex._prevflags & (TF_PREP_EOL | TF_PREP_SPACE)) {
        char op[] = { (char)_token, '\0' };
        reportDiagnostic(DiagnosticsId::DI_SUSPICIOUS_BRACKET, op, _token == _SC('(') ? "function call" : "access to member");
      }
    }
  }
}